

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_2_suite::test_one(void)

{
  undefined8 local_60;
  value_type local_58;
  undefined4 local_4c;
  size_type local_48;
  undefined1 local_3e;
  undefined1 local_3d [2];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  moment<double,_2> filter;
  
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38,1.0);
  local_3a[0] = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::empty
                          ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_3b = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x50,"void mean_double_2_suite::test_one()",local_3a,&local_3b);
  local_3d[0] = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::full
                          ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_3e = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x51,"void mean_double_2_suite::test_one()",local_3d,&local_3e);
  local_48 = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x52,"void mean_double_2_suite::test_one()",&local_48,&local_4c);
  local_58 = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_60 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x53,"void mean_double_2_suite::test_one()",&local_58,&local_60);
  return;
}

Assistant:

void test_one()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}